

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall
Assimp::ASE::Parser::ParseLV3MeshTFaceListBlock
          (Parser *this,uint iNumFaces,Mesh *mesh,uint iChannel)

{
  pointer pFVar1;
  bool bVar2;
  byte *pbVar3;
  byte bVar4;
  ulong uVar5;
  int local_44;
  uint iIndex;
  uint aiValues [3];
  
  local_44 = 0;
  do {
    while( true ) {
      pbVar3 = (byte *)this->filePtr;
      bVar4 = *pbVar3;
      if (bVar4 != 0x2a) break;
      this->filePtr = (char *)(pbVar3 + 1);
      bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_TFACE",10);
      if (!bVar2) {
        pbVar3 = (byte *)this->filePtr;
        bVar4 = *pbVar3;
        break;
      }
      iIndex = 0;
      ParseLV4MeshLongTriple(this,aiValues,&iIndex);
      uVar5 = (ulong)iIndex;
      if ((iIndex < iNumFaces) &&
         (pFVar1 = (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                   super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl
                   .super__Vector_impl_data._M_start,
         uVar5 < (ulong)(((long)(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
                                super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1) / 0x84)))
      {
        pFVar1[uVar5].amUVIndices[iChannel][0] = aiValues[0];
        (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5].amUVIndices[iChannel][1] = aiValues[1];
        (mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
        super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5].amUVIndices[iChannel][2] = aiValues[2];
      }
      else {
        LogWarning(this,"UV-Face has an invalid index. It will be ignored");
      }
    }
    if ((bVar4 - 0xc < 2) || (bVar4 == 10)) {
      if (this->bLastWasEndLine != false) goto LAB_003e20ad;
      this->iLineNumber = this->iLineNumber + 1;
      bVar2 = true;
    }
    else {
      if (bVar4 == 0x7b) {
        local_44 = local_44 + 1;
      }
      else if (bVar4 == 0x7d) {
        local_44 = local_44 + -1;
        if (local_44 == 0) {
          this->filePtr = (char *)(pbVar3 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else if (bVar4 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_TFACE_LIST chunk (Level 3)")
        ;
      }
LAB_003e20ad:
      bVar2 = false;
    }
    this->bLastWasEndLine = bVar2;
    this->filePtr = (char *)(pbVar3 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshTFaceListBlock(unsigned int iNumFaces,
    ASE::Mesh& mesh, unsigned int iChannel)
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Face entry
            if (TokenMatch(filePtr,"MESH_TFACE" ,10))
            {
                unsigned int aiValues[3];
                unsigned int iIndex = 0;

                ParseLV4MeshLongTriple(aiValues,iIndex);
                if (iIndex >= iNumFaces || iIndex >= mesh.mFaces.size())
                {
                    LogWarning("UV-Face has an invalid index. It will be ignored");
                }
                else
                {
                    // copy UV indices
                    mesh.mFaces[iIndex].amUVIndices[iChannel][0] = aiValues[0];
                    mesh.mFaces[iIndex].amUVIndices[iChannel][1] = aiValues[1];
                    mesh.mFaces[iIndex].amUVIndices[iChannel][2] = aiValues[2];
                }
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_TFACE_LIST");
    }
    return;
}